

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O1

void UpdateMConcatNode(Col_Word node)

{
  byte *pbVar1;
  byte *pbVar2;
  Col_Word CVar3;
  byte *pbVar4;
  byte *pbVar5;
  Col_Word CVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uchar uVar10;
  byte bVar11;
  uint uVar12;
  size_t sVar13;
  size_t sVar14;
  undefined2 uVar15;
  Col_Word right;
  Col_Word left;
  Col_Word left2;
  byte *local_70;
  byte *local_68;
  uint local_5c;
  byte *local_58;
  byte *local_50;
  byte *local_48;
  Col_Word local_40;
  byte *local_38;
  
  local_68 = *(byte **)(node + 0x10);
  bVar7 = GetDepth((Col_Word)local_68);
  pbVar1 = *(byte **)(node + 0x18);
  local_70 = pbVar1;
  bVar8 = GetDepth((Col_Word)pbVar1);
  pbVar2 = (byte *)node;
  if ((((ulong)pbVar1 & 0xf) != 0) &&
     (pbVar2 = (byte *)node, (0x11000100U >> ((uint)pbVar1 & 0x1f) & 1) != 0)) {
LAB_00110643:
    pbVar2 = local_68;
    bVar9 = *(byte *)node;
    sVar13 = Col_ListLength((Col_Word)local_68);
    pbVar1 = local_70;
    if (bVar8 < bVar7) {
      bVar8 = bVar7;
    }
    *(byte *)node = 0x26;
    *(byte *)(node + 1) = bVar8 + 1;
    sVar14 = Col_ListLength((Col_Word)local_70);
    uVar15 = (undefined2)sVar13;
    if (0xffff < sVar13) {
      uVar15 = 0;
    }
    *(size_t *)(node + 8) = sVar14 + sVar13;
    *(undefined2 *)(node + 2) = uVar15;
    *(byte **)(node + 0x10) = pbVar2;
    *(byte **)(node + 0x18) = pbVar1;
    if ((bVar9 & 1) != 0) {
      *(byte *)node = *(byte *)node | 1;
    }
    return;
  }
  do {
    local_48 = pbVar2;
    if (bVar8 + 1 < (uint)bVar7) {
      if (local_68 == (byte *)0x0) {
        uVar12 = 0;
      }
      else if (((ulong)local_68 & 0xf) == 0) {
        uVar12 = -(uint)((*local_68 & 2) == 0) | *local_68 & 0xfffffffe;
      }
      else {
        uVar12 = immediateWordTypes[(uint)local_68 & 0x1f];
      }
      if (uVar12 != 0x26) {
        ConvertToMConcatNode((Col_Word *)&local_68);
      }
      pbVar4 = local_68;
      pbVar1 = *(byte **)(local_68 + 0x10);
      bVar7 = GetDepth((Col_Word)pbVar1);
      pbVar2 = *(byte **)(pbVar4 + 0x18);
      local_50 = pbVar2;
      bVar9 = GetDepth((Col_Word)pbVar2);
      local_58 = pbVar1;
      if (bVar7 < bVar9) {
        if (pbVar2 == (byte *)0x0) {
          uVar12 = 0;
        }
        else if (((ulong)pbVar2 & 0xf) == 0) {
          uVar12 = -(uint)((*pbVar2 & 2) == 0) | *pbVar2 & 0xfffffffe;
        }
        else {
          uVar12 = immediateWordTypes[(uint)pbVar2 & 0x1f];
        }
        if (uVar12 != 0x26) {
          ConvertToMConcatNode((Col_Word *)&local_50);
        }
        pbVar2 = local_50;
        CVar3 = *(Col_Word *)(local_50 + 0x10);
        local_40 = *(Col_Word *)(local_50 + 0x18);
        uVar10 = GetDepth(local_40);
        local_5c = CONCAT31(local_5c._1_3_,uVar10);
        bVar9 = GetDepth(CVar3);
        sVar13 = Col_ListLength((Col_Word)pbVar1);
        if (bVar7 <= bVar9) {
          bVar7 = bVar9;
        }
        bVar7 = bVar7 + 1;
        *pbVar4 = 0x26;
        pbVar4[1] = bVar7;
        sVar14 = Col_ListLength(CVar3);
        CVar6 = local_40;
        uVar15 = (undefined2)sVar13;
        if (0xffff < sVar13) {
          uVar15 = 0;
        }
        *(size_t *)(pbVar4 + 8) = sVar14 + sVar13;
        *(undefined2 *)(pbVar4 + 2) = uVar15;
        *(byte **)(pbVar4 + 0x10) = local_58;
        *(Col_Word *)(pbVar4 + 0x18) = CVar3;
        sVar13 = Col_ListLength(local_40);
        pbVar1 = local_70;
        if (bVar8 < (byte)local_5c) {
          bVar8 = (byte)local_5c;
        }
        *pbVar2 = 0x26;
        pbVar2[1] = bVar8 + 1;
        sVar14 = Col_ListLength((Col_Word)local_70);
        *(size_t *)(pbVar2 + 8) = sVar14 + sVar13;
        uVar15 = (undefined2)sVar13;
        if (0xffff < sVar13) {
          uVar15 = 0;
        }
        *(undefined2 *)(pbVar2 + 2) = uVar15;
        *(Col_Word *)(pbVar2 + 0x10) = CVar6;
        *(byte **)(pbVar2 + 0x18) = pbVar1;
        local_70 = pbVar2;
        bVar8 = bVar8 + 1;
      }
      else {
        sVar13 = Col_ListLength((Col_Word)pbVar2);
        bVar9 = GetDepth((Col_Word)pbVar2);
        pbVar1 = local_70;
        if (bVar8 < bVar9) {
          bVar8 = bVar9;
        }
        *pbVar4 = 0x26;
        pbVar4[1] = bVar8 + 1;
        sVar14 = Col_ListLength((Col_Word)local_70);
        uVar15 = (undefined2)sVar13;
        if (0xffff < sVar13) {
          uVar15 = 0;
        }
        *(size_t *)(pbVar4 + 8) = sVar14 + sVar13;
        *(undefined2 *)(pbVar4 + 2) = uVar15;
        *(byte **)(pbVar4 + 0x10) = pbVar2;
        *(byte **)(pbVar4 + 0x18) = pbVar1;
        local_70 = pbVar4;
        local_68 = local_58;
        bVar8 = bVar8 + 1;
      }
    }
    else {
      node = (Col_Word)local_48;
      if ((uint)bVar8 <= bVar7 + 1) goto LAB_00110643;
      if (local_70 == (byte *)0x0) {
        uVar12 = 0;
      }
      else if (((ulong)local_70 & 0xf) == 0) {
        uVar12 = -(uint)((*local_70 & 2) == 0) | *local_70 & 0xfffffffe;
      }
      else {
        uVar12 = immediateWordTypes[(uint)local_70 & 0x1f];
      }
      if (uVar12 != 0x26) {
        ConvertToMConcatNode((Col_Word *)&local_70);
      }
      pbVar4 = local_70;
      pbVar1 = *(byte **)(local_70 + 0x10);
      pbVar2 = *(byte **)(local_70 + 0x18);
      local_50 = pbVar1;
      bVar9 = GetDepth((Col_Word)pbVar2);
      pbVar5 = local_68;
      local_5c = (uint)bVar9;
      local_58 = pbVar2;
      if ((int)(uint)bVar9 < (int)(bVar8 - 1)) {
        if (pbVar1 == (byte *)0x0) {
          uVar12 = 0;
        }
        else if (((ulong)pbVar1 & 0xf) == 0) {
          uVar12 = -(uint)((*pbVar1 & 2) == 0) | *pbVar1 & 0xfffffffe;
        }
        else {
          uVar12 = immediateWordTypes[(uint)pbVar1 & 0x1f];
        }
        if (uVar12 != 0x26) {
          ConvertToMConcatNode((Col_Word *)&local_50);
        }
        pbVar1 = local_50;
        CVar3 = *(Col_Word *)(local_50 + 0x10);
        bVar8 = GetDepth(CVar3);
        local_40 = *(Col_Word *)(pbVar1 + 0x18);
        bVar11 = GetDepth(local_40);
        local_38 = local_68;
        sVar13 = Col_ListLength((Col_Word)local_68);
        if (bVar8 < bVar7) {
          bVar8 = bVar7;
        }
        bVar7 = bVar8 + 1;
        *pbVar1 = 0x26;
        pbVar1[1] = bVar7;
        sVar14 = Col_ListLength(CVar3);
        CVar6 = local_40;
        *(size_t *)(pbVar1 + 8) = sVar14 + sVar13;
        uVar15 = (undefined2)sVar13;
        if (0xffff < sVar13) {
          uVar15 = 0;
        }
        *(undefined2 *)(pbVar1 + 2) = uVar15;
        *(byte **)(pbVar1 + 0x10) = local_38;
        *(Col_Word *)(pbVar1 + 0x18) = CVar3;
        local_68 = pbVar1;
        sVar13 = Col_ListLength(local_40);
        pbVar1 = local_58;
        bVar8 = (byte)local_5c;
        if (bVar9 < bVar11) {
          bVar8 = bVar11;
        }
        *pbVar4 = 0x26;
        pbVar4[1] = bVar8 + 1;
        sVar14 = Col_ListLength((Col_Word)local_58);
        uVar15 = (undefined2)sVar13;
        if (0xffff < sVar13) {
          uVar15 = 0;
        }
        *(size_t *)(pbVar4 + 8) = sVar14 + sVar13;
        *(undefined2 *)(pbVar4 + 2) = uVar15;
        *(Col_Word *)(pbVar4 + 0x10) = CVar6;
        *(byte **)(pbVar4 + 0x18) = pbVar1;
        bVar8 = bVar8 + 1;
      }
      else {
        sVar13 = Col_ListLength((Col_Word)local_68);
        bVar11 = GetDepth((Col_Word)pbVar1);
        if (bVar11 < bVar7) {
          bVar11 = bVar7;
        }
        bVar7 = bVar11 + 1;
        *pbVar4 = 0x26;
        pbVar4[1] = bVar8;
        sVar14 = Col_ListLength((Col_Word)pbVar1);
        *(size_t *)(pbVar4 + 8) = sVar14 + sVar13;
        uVar15 = (undefined2)sVar13;
        if (0xffff < sVar13) {
          uVar15 = 0;
        }
        *(undefined2 *)(pbVar4 + 2) = uVar15;
        *(byte **)(pbVar4 + 0x10) = pbVar5;
        *(byte **)(pbVar4 + 0x18) = pbVar1;
        local_68 = pbVar4;
        local_70 = local_58;
        bVar8 = bVar9;
      }
    }
    pbVar4 = local_48;
    pbVar2 = local_68;
    sVar13 = Col_ListLength((Col_Word)local_68);
    pbVar1 = local_70;
    bVar9 = bVar8;
    if (bVar8 < bVar7) {
      bVar9 = bVar7;
    }
    *pbVar4 = 0x26;
    pbVar4[1] = bVar9 + 1;
    sVar14 = Col_ListLength((Col_Word)local_70);
    uVar15 = (undefined2)sVar13;
    if (0xffff < sVar13) {
      uVar15 = 0;
    }
    *(size_t *)(pbVar4 + 8) = sVar14 + sVar13;
    *(undefined2 *)(pbVar4 + 2) = uVar15;
    *(byte **)(pbVar4 + 0x10) = pbVar2;
    *(byte **)(pbVar4 + 0x18) = pbVar1;
    pbVar2 = local_48;
  } while( true );
}

Assistant:

static void
UpdateMConcatNode(
    Col_Word node)  /*!< Mutable concat list node. */
{
    Col_Word left, right;
    unsigned char leftDepth, rightDepth;
    size_t leftLength;
    int pinned;

    ASSERT(WORD_TYPE(node) == WORD_TYPE_MCONCATLIST);

    left = WORD_CONCATLIST_LEFT(node);
    leftDepth = GetDepth(left);
    right = WORD_CONCATLIST_RIGHT(node);
    rightDepth = GetDepth(right);

    if (WORD_TYPE(right) != WORD_TYPE_CIRCLIST) {
        /*
         * Balance tree.
         */

        for (;;) {
            if (leftDepth > rightDepth+1) {
                /*
                 * Left is deeper by more than 1 level, rebalance.
                 */

                unsigned char left1Depth, left2Depth;
                Col_Word left1, left2;

                ASSERT(leftDepth >= 2);
                if (WORD_TYPE(left) != WORD_TYPE_MCONCATLIST) {
                    ConvertToMConcatNode(&left);
                }
                ASSERT(WORD_TYPE(left) == WORD_TYPE_MCONCATLIST);

                left1 = WORD_CONCATLIST_LEFT(left);
                left1Depth = GetDepth(left1);
                left2 = WORD_CONCATLIST_RIGHT(left);
                left2Depth = GetDepth(left2);
                if (left1Depth < left2Depth) {
                    /*
                     * Left2 is deeper, split it between both arms.
                     */

                    Col_Word left21, left22;
                    unsigned char left21Depth, left22Depth;

                    if (WORD_TYPE(left2) != WORD_TYPE_MCONCATLIST) {
                        ConvertToMConcatNode(&left2);
                    }
                    ASSERT(WORD_TYPE(left2) == WORD_TYPE_MCONCATLIST);
                    ASSERT(WORD_CONCATLIST_DEPTH(left2) >= 1);

                    left21 = WORD_CONCATLIST_LEFT(left2);
                    left22 = WORD_CONCATLIST_RIGHT(left2);
                    left22Depth = GetDepth(left22);
                    left21Depth = GetDepth(left21);

                    /*
                     * Update left node.
                     */

                    leftLength = Col_ListLength(left1);
                    leftDepth = (left1Depth>left21Depth?left1Depth:left21Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(left, leftDepth,
                            leftLength+Col_ListLength(left21), leftLength,
                            left1, left21);

                    /*
                     * Turn left2 into right node.
                     */

                    leftLength = Col_ListLength(left22);
                    rightDepth = (left22Depth>rightDepth?left22Depth:rightDepth)
                            + 1;
                    WORD_MCONCATLIST_INIT(left2, rightDepth,
                        leftLength+Col_ListLength(right), leftLength, left22,
                        right);
                    right = left2;
                } else {
                    /*
                     * Left1 is deeper or at the same level, rotate to right.
                     */

                    unsigned char left2Depth;

                    ASSERT(left1Depth >= 1);

                    /*
                     * Turn left into right node.
                     */

                    leftLength = Col_ListLength(left2);
                    left2Depth = GetDepth(left2);
                    rightDepth = (left2Depth>rightDepth?left2Depth:rightDepth)
                            + 1;
                    WORD_MCONCATLIST_INIT(left, rightDepth,
                            leftLength+Col_ListLength(right), leftLength, left2,
                            right);
                    right = left;

                    /*
                     * Turn left1 into left node.
                     */

                    left = left1;
                    leftDepth = left1Depth;
                }
            } else if (leftDepth+1 < rightDepth) {
                /*
                 * Right is deeper by more than 1 level, rebalance.
                 */

                unsigned char right2Depth;
                Col_Word right1, right2;

                ASSERT(rightDepth >= 2);
                if (WORD_TYPE(right) != WORD_TYPE_MCONCATLIST) {
                    ConvertToMConcatNode(&right);
                }
                ASSERT(WORD_TYPE(right) == WORD_TYPE_MCONCATLIST);

                right1 = WORD_CONCATLIST_LEFT(right);
                right2 = WORD_CONCATLIST_RIGHT(right);
                right2Depth = GetDepth(right2);
                if (right2Depth < rightDepth-1) {
                    /*
                     * Right1 is deeper, split it between both arms.
                     */

                    Col_Word right11, right12;
                    unsigned char right11Depth, right12Depth;

                    if (WORD_TYPE(right1) != WORD_TYPE_MCONCATLIST) {
                        ConvertToMConcatNode(&right1);
                    }
                    ASSERT(WORD_TYPE(right1) == WORD_TYPE_MCONCATLIST);
                    ASSERT(WORD_CONCATLIST_DEPTH(right1) >= 1);

                    right11 = WORD_CONCATLIST_LEFT(right1);
                    right11Depth = GetDepth(right11);
                    right12 = WORD_CONCATLIST_RIGHT(right1);
                    right12Depth = GetDepth(right12);

                    /*
                     * Turn right1 into left node.
                     */

                    leftLength = Col_ListLength(left);
                    leftDepth = (leftDepth>right11Depth?leftDepth:right11Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(right1, leftDepth,
                            leftLength+Col_ListLength(right11), leftLength,
                            left, right11);
                    left = right1;

                    /*
                     * Update right node.
                     */

                    leftLength = Col_ListLength(right12);
                    rightDepth = (right12Depth>right2Depth?right12Depth:right2Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(right, rightDepth,
                            leftLength+Col_ListLength(right2), leftLength,
                            right12, right2);
                } else {
                    /*
                     * Right2 is deeper or at the same level, rotate to left.
                     */

                    unsigned char right1Depth;

                    ASSERT(right2Depth >= 1);

                    /*
                     * Turn right into left node.
                     */

                    leftLength = Col_ListLength(left);
                    right1Depth = GetDepth(right1);
                    leftDepth = (leftDepth>right1Depth?leftDepth:right1Depth)
                            + 1;
                    WORD_MCONCATLIST_INIT(right, rightDepth,
                            leftLength+Col_ListLength(right1), leftLength, left,
                            right1);
                    left = right;

                    /*
                     * Turn right2 into right node.
                     */

                    right = right2;
                    rightDepth = right2Depth;
                }
            } else {
                /*
                 * Tree is balanced, stop there.
                 */

                break;
            }

            /*
             * Update node.
             */

            leftLength = Col_ListLength(left);
            WORD_MCONCATLIST_INIT(node,
                    (leftDepth>rightDepth?leftDepth:rightDepth) + 1,
                    leftLength+Col_ListLength(right), leftLength, left, right);
        }
    }

    /*
     * Update node.
     */

    pinned = WORD_PINNED(node);
    leftLength = Col_ListLength(left);
    WORD_MCONCATLIST_INIT(node,
            (leftDepth>rightDepth?leftDepth:rightDepth) + 1,
            leftLength+Col_ListLength(right), leftLength, left, right);
    if (pinned) {
        WORD_SET_PINNED(node);
    }
}